

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5StorageInsert(int *pRc,Fts5FullTable *pTab,sqlite3_value **apVal,i64 *piRowid)

{
  int iVar1;
  
  iVar1 = *pRc;
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts5StorageContentInsert(pTab->pStorage,apVal,piRowid);
  }
  if (iVar1 == 0) {
    iVar1 = sqlite3Fts5StorageIndexInsert(pTab->pStorage,apVal,*piRowid);
  }
  *pRc = iVar1;
  return;
}

Assistant:

static void fts5StorageInsert(
  int *pRc, 
  Fts5FullTable *pTab, 
  sqlite3_value **apVal, 
  i64 *piRowid
){
  int rc = *pRc;
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, piRowid);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal, *piRowid);
  }
  *pRc = rc;
}